

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O0

void __thiscall
boost::runtime::arguments_store::
set<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (arguments_store *this,cstring *parameter_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value)

{
  typed_argument<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  key_type *in_RDX;
  map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
  *in_RSI;
  shared_ptr<boost::runtime::argument> *in_RDI;
  typed_argument<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  shared_ptr<boost::runtime::argument> *in_stack_ffffffffffffffd0;
  
  this_00 = (typed_argument<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)operator_new(0x28);
  typed_argument<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_argument(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_RDI);
  shared_ptr<boost::runtime::argument>::
  shared_ptr<boost::runtime::typed_argument<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::
  map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
  ::operator[](in_RSI,in_RDX);
  shared_ptr<boost::runtime::argument>::operator=
            ((shared_ptr<boost::runtime::argument> *)this_00,in_RDI);
  shared_ptr<boost::runtime::argument>::~shared_ptr
            ((shared_ptr<boost::runtime::argument> *)0x270fcf);
  return;
}

Assistant:

void        set( cstring parameter_name, T const& value )
    {
        m_arguments[parameter_name] = argument_ptr( new typed_argument<T>( value ) );
    }